

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

GLuint compile_shader(string *p_content,ShaderType p_type)

{
  GLuint p_shader;
  ostream *poVar1;
  char *shader_code_cstr;
  
  if (p_type < (GEOMETRY|FRAGMENT)) {
    p_shader = (*glad_glCreateShader)(*(GLenum *)(&DAT_0057f858 + (ulong)p_type * 4));
    shader_code_cstr = (p_content->_M_dataplus)._M_p;
    (*glad_glShaderSource)(p_shader,1,&shader_code_cstr,(GLint *)0x0);
    (*glad_glCompileShader)(p_shader);
    test_shader_code_compilation(p_shader,p_type);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"unable to compile shader");
    p_shader = 0;
    std::operator<<(poVar1,"\n");
  }
  return p_shader;
}

Assistant:

GLuint compile_shader(
    const std::string &p_content,
    const ShaderType p_type) noexcept
{
    GLuint shader_id = DEFAULT_SHADER_ID;

    switch (p_type)
    {
    case ShaderType::VERTEX:
    {
        shader_id = glCreateShader(GL_VERTEX_SHADER);
        break;
    };
    case ShaderType::FRAGMENT:
    {
        shader_id = glCreateShader(GL_FRAGMENT_SHADER);
        break;
    };
    case ShaderType::GEOMETRY:
    {
        shader_id = glCreateShader(GL_GEOMETRY_SHADER);
        break;
    }
    default:
    {
        std::cerr << "unable to compile shader"
                  << "\n";
        return shader_id;
    };
    };

    const char *shader_code_cstr = p_content.c_str();
    glShaderSource(shader_id, 1, &shader_code_cstr, nullptr);
    glCompileShader(shader_id);
    test_shader_code_compilation(shader_id, p_type);
    return shader_id;
}